

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int resolve_conflict(action *apx,action *apy)

{
  symbol *psVar1;
  symbol *psVar2;
  int local_2c;
  int errcnt;
  symbol *spy;
  symbol *spx;
  action *apy_local;
  action *apx_local;
  
  local_2c = 0;
  if (apx->sp != apy->sp) {
    __assert_fail("apx->sp==apy->sp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                  ,0x445,"int resolve_conflict(struct action *, struct action *)");
  }
  if ((apx->type == SHIFT) && (apy->type == SHIFT)) {
    apy->type = SSCONFLICT;
    local_2c = 1;
  }
  if ((apx->type == SHIFT) && (apy->type == REDUCE)) {
    psVar1 = apx->sp;
    psVar2 = ((apy->x).rp)->precsym;
    if (((psVar2 == (symbol *)0x0) || (psVar1->prec < 0)) || (psVar2->prec < 0)) {
      apy->type = SRCONFLICT;
      local_2c = local_2c + 1;
    }
    else if (psVar2->prec < psVar1->prec) {
      apy->type = RD_RESOLVED;
    }
    else if (psVar1->prec < psVar2->prec) {
      apx->type = SH_RESOLVED;
    }
    else if ((psVar1->prec == psVar2->prec) && (psVar1->assoc == RIGHT)) {
      apy->type = RD_RESOLVED;
    }
    else if ((psVar1->prec == psVar2->prec) && (psVar1->assoc == LEFT)) {
      apx->type = SH_RESOLVED;
    }
    else {
      if ((psVar1->prec != psVar2->prec) || (psVar1->assoc != NONE)) {
        __assert_fail("spx->prec==spy->prec && spx->assoc==NONE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                      ,0x45a,"int resolve_conflict(struct action *, struct action *)");
      }
      apy->type = ERROR;
    }
  }
  else if ((apx->type == REDUCE) && (apy->type == REDUCE)) {
    psVar1 = ((apx->x).rp)->precsym;
    psVar2 = ((apy->x).rp)->precsym;
    if ((((psVar1 == (symbol *)0x0) || (psVar2 == (symbol *)0x0)) || (psVar1->prec < 0)) ||
       ((psVar2->prec < 0 || (psVar1->prec == psVar2->prec)))) {
      apy->type = RRCONFLICT;
      local_2c = local_2c + 1;
    }
    else if (psVar2->prec < psVar1->prec) {
      apy->type = RD_RESOLVED;
    }
    else if (psVar1->prec < psVar2->prec) {
      apx->type = RD_RESOLVED;
    }
  }
  else if (((((apx->type != SH_RESOLVED) && (apx->type != RD_RESOLVED)) && (apx->type != SSCONFLICT)
            ) && ((apx->type != SRCONFLICT && (apx->type != RRCONFLICT)))) &&
          ((apy->type != SH_RESOLVED &&
           (((apy->type != RD_RESOLVED && (apy->type != SSCONFLICT)) &&
            ((apy->type != SRCONFLICT && (apy->type != RRCONFLICT)))))))) {
    __assert_fail("apx->type==SH_RESOLVED || apx->type==RD_RESOLVED || apx->type==SSCONFLICT || apx->type==SRCONFLICT || apx->type==RRCONFLICT || apy->type==SH_RESOLVED || apy->type==RD_RESOLVED || apy->type==SSCONFLICT || apy->type==SRCONFLICT || apy->type==RRCONFLICT"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                  ,0x475,"int resolve_conflict(struct action *, struct action *)");
  }
  return local_2c;
}

Assistant:

static int resolve_conflict(
  struct action *apx,
  struct action *apy
){
  struct symbol *spx, *spy;
  int errcnt = 0;
  assert( apx->sp==apy->sp );  /* Otherwise there would be no conflict */
  if( apx->type==SHIFT && apy->type==SHIFT ){
    apy->type = SSCONFLICT;
    errcnt++;
  }
  if( apx->type==SHIFT && apy->type==REDUCE ){
    spx = apx->sp;
    spy = apy->x.rp->precsym;
    if( spy==0 || spx->prec<0 || spy->prec<0 ){
      /* Not enough precedence information. */
      apy->type = SRCONFLICT;
      errcnt++;
    }else if( spx->prec>spy->prec ){    /* higher precedence wins */
      apy->type = RD_RESOLVED;
    }else if( spx->prec<spy->prec ){
      apx->type = SH_RESOLVED;
    }else if( spx->prec==spy->prec && spx->assoc==RIGHT ){ /* Use operator */
      apy->type = RD_RESOLVED;                             /* associativity */
    }else if( spx->prec==spy->prec && spx->assoc==LEFT ){  /* to break tie */
      apx->type = SH_RESOLVED;
    }else{
      assert( spx->prec==spy->prec && spx->assoc==NONE );
      apy->type = ERROR;
    }
  }else if( apx->type==REDUCE && apy->type==REDUCE ){
    spx = apx->x.rp->precsym;
    spy = apy->x.rp->precsym;
    if( spx==0 || spy==0 || spx->prec<0 ||
    spy->prec<0 || spx->prec==spy->prec ){
      apy->type = RRCONFLICT;
      errcnt++;
    }else if( spx->prec>spy->prec ){
      apy->type = RD_RESOLVED;
    }else if( spx->prec<spy->prec ){
      apx->type = RD_RESOLVED;
    }
  }else{
    assert( 
      apx->type==SH_RESOLVED ||
      apx->type==RD_RESOLVED ||
      apx->type==SSCONFLICT ||
      apx->type==SRCONFLICT ||
      apx->type==RRCONFLICT ||
      apy->type==SH_RESOLVED ||
      apy->type==RD_RESOLVED ||
      apy->type==SSCONFLICT ||
      apy->type==SRCONFLICT ||
      apy->type==RRCONFLICT
    );
    /* The REDUCE/SHIFT case cannot happen because SHIFTs come before
    ** REDUCEs on the list.  If we reach this point it must be because
    ** the parser conflict had already been resolved. */
  }
  return errcnt;
}